

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O0

string * __thiscall
soul::ASTUtilities::getTypeArraySignature_abi_cxx11_
          (string *__return_storage_ptr__,ASTUtilities *this,TypeArray *types)

{
  bool bVar1;
  size_t __val;
  Structure *this_00;
  void *o;
  Type local_f0;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_88 [8];
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Type *local_40;
  Type *t;
  Type *__end2;
  Type *__begin2;
  TypeArray *__range2;
  ArrayWithPreallocation<soul::Type,_8UL> *local_18;
  TypeArray *types_local;
  string *result;
  
  __range2._7_1_ = 0;
  local_18 = (ArrayWithPreallocation<soul::Type,_8UL> *)this;
  types_local = (TypeArray *)__return_storage_ptr__;
  __val = ArrayWithPreallocation<soul::Type,_8UL>::size
                    ((ArrayWithPreallocation<soul::Type,_8UL> *)this);
  std::__cxx11::to_string(__return_storage_ptr__,__val);
  __begin2 = (Type *)local_18;
  __end2 = ArrayWithPreallocation<soul::Type,_8UL>::begin(local_18);
  t = ArrayWithPreallocation<soul::Type,_8UL>::end
                ((ArrayWithPreallocation<soul::Type,_8UL> *)__begin2);
  for (; __end2 != t; __end2 = __end2 + 1) {
    local_40 = __end2;
    bVar1 = Type::isStruct(__end2);
    if (bVar1) {
      Type::getStruct((Type *)local_88);
      this_00 = RefCountedPtr<soul::Structure>::get((RefCountedPtr<soul::Structure> *)local_88);
      getSignatureString_abi_cxx11_((string *)(local_88 + 8),(ASTUtilities *)this_00,o);
      std::operator+(&local_60,"_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_88 + 8));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)(local_88 + 8));
      RefCountedPtr<soul::Structure>::~RefCountedPtr((RefCountedPtr<soul::Structure> *)local_88);
    }
    else {
      Type::withConstAndRefFlags(&local_f0,local_40,false,false);
      Type::getShortIdentifierDescription_abi_cxx11_(&local_d8,&local_f0);
      std::operator+(&local_b8,"_",&local_d8);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      Type::~Type(&local_f0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string getTypeArraySignature (const AST::TypeArray& types)
    {
        auto result = std::to_string (types.size());

        for (auto& t : types)
        {
            if (t.isStruct())
                result += "_" + getSignatureString (t.getStruct().get());
            else
                result += "_" + t.withConstAndRefFlags (false, false).getShortIdentifierDescription();
        }

        return result;
    }